

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1fad4::FileSystemTest_testRecursiveRemovalDoesNotFollowSymlinks_Test::TestBody
          (FileSystemTest_testRecursiveRemovalDoesNotFollowSymlinks_Test *this)

{
  Child CVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int *rhs;
  int iVar6;
  __mode_t _Var7;
  char *in_R9;
  StringRef namePrefix;
  StringRef Filename;
  StringRef Filename_00;
  AssertHelper local_890;
  AssertionResult gtest_ar__2;
  Child local_870 [3];
  int res;
  uint local_850;
  uint uStack_84c;
  Child local_848 [3];
  StatStruct statbuf;
  SmallString<256U> tempDir;
  SmallString<256U> directoryLinkPath;
  SmallString<256U> linkPath;
  SmallString<256U> otherFile;
  SmallString<256U> otherDir;
  SmallString<256U> file;
  TmpDir rootTempDir;
  Twine *pTVar8;
  
  namePrefix.Length = 8;
  namePrefix.Data = "TestBody";
  llbuild::TmpDir::TmpDir(&rootTempDir,namePrefix);
  llbuild::TmpDir::str_abi_cxx11_((string *)&otherDir,&rootTempDir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&file.super_SmallVector<char,_256U>,
             (char *)otherDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
             (char *)(CONCAT44(otherDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                               super_SmallVectorTemplateBase<char,_true>.
                               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                               Capacity,otherDir.super_SmallVector<char,_256U>.
                                        super_SmallVectorImpl<char>.
                                        super_SmallVectorTemplateBase<char,_true>.
                                        super_SmallVectorTemplateCommon<char,_void>.
                                        super_SmallVectorBase.Size) +
                     (long)otherDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX)
            );
  std::__cxx11::string::_M_dispose();
  llvm::Twine::Twine((Twine *)&otherDir,"test.txt");
  llvm::Twine::Twine((Twine *)&otherFile,"");
  llvm::Twine::Twine((Twine *)&tempDir,"");
  llvm::Twine::Twine((Twine *)&linkPath,"");
  llvm::sys::path::append
            (&file.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)&otherDir,
             (Twine *)&otherFile,(Twine *)&tempDir,(Twine *)&linkPath);
  tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX._0_4_ = 0;
  _local_850 = std::_V2::system_category();
  Filename.Length._4_4_ = 0;
  Filename._0_12_ =
       file.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase._0_12_;
  tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase._8_8_ = _local_850;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)&otherDir,Filename,(error_code *)&tempDir,F_Text);
  linkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  linkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0;
  linkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX._0_1_ =
       (int)tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.BeginX == 0;
  if (!(bool)linkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
             super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
             super_SmallVectorBase.BeginX._0_1_) {
    testing::Message::Message((Message *)&directoryLinkPath);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&otherFile,(internal *)&linkPath,(AssertionResult *)0x180e70,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&statbuf,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x6f,(char *)otherFile.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                             super_SmallVectorTemplateBase<char,_true>.
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&statbuf,(Message *)&directoryLinkPath);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&statbuf);
    std::__cxx11::string::_M_dispose();
    if ((long *)CONCAT44(directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>
                         .super_SmallVectorTemplateBase<char,_true>.
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX.
                         _4_4_,(int)directoryLinkPath.super_SmallVector<char,_256U>.
                                    super_SmallVectorImpl<char>.
                                    super_SmallVectorTemplateBase<char,_true>.
                                    super_SmallVectorTemplateCommon<char,_void>.
                                    super_SmallVectorBase.BeginX) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(directoryLinkPath.super_SmallVector<char,_256U>.
                                     super_SmallVectorImpl<char>.
                                     super_SmallVectorTemplateBase<char,_true>.
                                     super_SmallVectorTemplateCommon<char,_void>.
                                     super_SmallVectorBase.BeginX._4_4_,
                                     (int)directoryLinkPath.super_SmallVector<char,_256U>.
                                          super_SmallVectorImpl<char>.
                                          super_SmallVectorTemplateBase<char,_true>.
                                          super_SmallVectorTemplateCommon<char,_void>.
                                          super_SmallVectorBase.BeginX) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&linkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                    super_SmallVectorTemplateBase<char,_true>.
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size);
  iVar6 = 0x180817;
  llvm::raw_ostream::operator<<((raw_ostream *)&otherDir,"Hello, world!");
  llvm::raw_fd_ostream::close((raw_fd_ostream *)&otherDir,iVar6);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&otherDir);
  llbuild::TmpDir::str_abi_cxx11_((string *)&otherFile,&rootTempDir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&otherDir.super_SmallVector<char,_256U>,
             (char *)otherFile.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
             (char *)(CONCAT44(otherFile.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                               super_SmallVectorTemplateBase<char,_true>.
                               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                               Capacity,otherFile.super_SmallVector<char,_256U>.
                                        super_SmallVectorImpl<char>.
                                        super_SmallVectorTemplateBase<char,_true>.
                                        super_SmallVectorTemplateCommon<char,_void>.
                                        super_SmallVectorBase.Size) +
                     (long)otherFile.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX)
            );
  std::__cxx11::string::_M_dispose();
  pTVar8 = (Twine *)&otherFile;
  llvm::Twine::Twine(pTVar8,"other_dir");
  llvm::Twine::Twine((Twine *)&tempDir,"");
  llvm::Twine::Twine((Twine *)&linkPath,"");
  llvm::Twine::Twine((Twine *)&directoryLinkPath,"");
  llvm::sys::path::append
            (&otherDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,pTVar8,
             (Twine *)&tempDir,(Twine *)&linkPath,(Twine *)&directoryLinkPath);
  _Var7 = (__mode_t)pTVar8;
  pcVar3 = llvm::SmallString<256U>::c_str
                     ((SmallString<256U> *)&otherDir.super_SmallVector<char,_256U>);
  llbuild::basic::sys::mkdir(pcVar3,_Var7);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&otherFile.super_SmallVector<char,_256U>,
             (char *)otherDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
             (char *)((ulong)otherDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                             super_SmallVectorTemplateBase<char,_true>.
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size
                     + (long)otherDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                             super_SmallVectorTemplateBase<char,_true>.
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX));
  llvm::Twine::Twine((Twine *)&tempDir,"test.txt");
  llvm::Twine::Twine((Twine *)&linkPath,"");
  llvm::Twine::Twine((Twine *)&directoryLinkPath,"");
  llvm::Twine::Twine((Twine *)&statbuf,"");
  llvm::sys::path::append
            (&otherFile.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)&tempDir,
             (Twine *)&linkPath,(Twine *)&directoryLinkPath,(Twine *)&statbuf);
  directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX._0_4_ = 0;
  directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = local_850;
  directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = uStack_84c;
  Filename_00.Length._0_4_ =
       otherFile.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size;
  Filename_00.Data =
       (char *)otherFile.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.BeginX;
  Filename_00.Length._4_4_ = 0;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)&tempDir,Filename_00,(error_code *)&directoryLinkPath,F_Text);
  statbuf.st_ino = 0;
  statbuf.st_dev._0_1_ =
       (int)directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.BeginX == 0;
  if ((int)directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
           super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
           super_SmallVectorBase.BeginX != 0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&linkPath,(internal *)&statbuf,(AssertionResult *)0x180e70,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x7d,(char *)CONCAT71(linkPath.super_SmallVector<char,_256U>.
                                      super_SmallVectorImpl<char>.
                                      super_SmallVectorTemplateBase<char,_true>.
                                      super_SmallVectorTemplateCommon<char,_void>.
                                      super_SmallVectorBase.BeginX._1_7_,
                                      linkPath.super_SmallVector<char,_256U>.
                                      super_SmallVectorImpl<char>.
                                      super_SmallVectorTemplateBase<char,_true>.
                                      super_SmallVectorTemplateCommon<char,_void>.
                                      super_SmallVectorBase.BeginX._0_1_));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_848,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_848);
    std::__cxx11::string::_M_dispose();
    if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&statbuf.st_ino);
  iVar6 = 0x180817;
  llvm::raw_ostream::operator<<((raw_ostream *)&tempDir,"Hello, world!");
  llvm::raw_fd_ostream::close((raw_fd_ostream *)&tempDir,iVar6);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&tempDir);
  llbuild::TmpDir::str_abi_cxx11_((string *)&linkPath,&rootTempDir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&tempDir.super_SmallVector<char,_256U>,
             (char *)CONCAT71(linkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                              super_SmallVectorTemplateBase<char,_true>.
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX._1_7_,
                              linkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                              super_SmallVectorTemplateBase<char,_true>.
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX._0_1_),
             (char *)CONCAT71(linkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                              super_SmallVectorTemplateBase<char,_true>.
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX._1_7_,
                              linkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                              super_SmallVectorTemplateBase<char,_true>.
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX._0_1_) +
             linkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
             super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
             super_SmallVectorBase._8_8_);
  std::__cxx11::string::_M_dispose();
  pTVar8 = (Twine *)&linkPath;
  llvm::Twine::Twine(pTVar8,"root");
  pcVar3 = "";
  llvm::Twine::Twine((Twine *)&directoryLinkPath,"");
  llvm::Twine::Twine((Twine *)&statbuf,"");
  llvm::Twine::Twine((Twine *)&gtest_ar__2,"");
  llvm::sys::path::append
            (&tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,pTVar8,
             (Twine *)&directoryLinkPath,(Twine *)&statbuf,(Twine *)&gtest_ar__2);
  _Var7 = (__mode_t)pTVar8;
  pcVar4 = llvm::SmallString<256U>::c_str
                     ((SmallString<256U> *)&tempDir.super_SmallVector<char,_256U>);
  llbuild::basic::sys::mkdir(pcVar4,_Var7);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&linkPath.super_SmallVector<char,_256U>,
             (char *)CONCAT44(tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                              super_SmallVectorTemplateBase<char,_true>.
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX._4_4_,
                              (int)tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>
                                   .super_SmallVectorTemplateBase<char,_true>.
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX),
             (char *)CONCAT44(tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                              super_SmallVectorTemplateBase<char,_true>.
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX._4_4_,
                              (int)tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>
                                   .super_SmallVectorTemplateBase<char,_true>.
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX) +
             (tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase._8_8_ & 0xffffffff));
  llvm::Twine::Twine((Twine *)&directoryLinkPath,"link.txt");
  llvm::Twine::Twine((Twine *)&statbuf,"");
  llvm::Twine::Twine((Twine *)&gtest_ar__2,"");
  llvm::Twine::Twine((Twine *)local_848,"");
  llvm::sys::path::append
            (&linkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,
             (Twine *)&directoryLinkPath,(Twine *)&statbuf,(Twine *)&gtest_ar__2,(Twine *)local_848)
  ;
  pcVar4 = llvm::SmallString<256U>::c_str(&file);
  pcVar5 = llvm::SmallString<256U>::c_str
                     ((SmallString<256U> *)&linkPath.super_SmallVector<char,_256U>);
  res = llbuild::basic::sys::symlink(pcVar4,pcVar5);
  statbuf.st_dev._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&directoryLinkPath,"res","0",&res,(int *)&statbuf);
  if ((char)directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.BeginX == '\0') {
    testing::Message::Message((Message *)&statbuf);
    if (directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase._8_8_ != 0) {
      pcVar3 = *(char **)directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>
                         .super_SmallVectorTemplateBase<char,_true>.
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x89,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&statbuf);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    if ((long *)CONCAT44(statbuf.st_dev._4_4_,(undefined4)statbuf.st_dev) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(statbuf.st_dev._4_4_,(undefined4)statbuf.st_dev) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                    super_SmallVectorTemplateBase<char,_true>.
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&directoryLinkPath.super_SmallVector<char,_256U>,
             (char *)CONCAT44(tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                              super_SmallVectorTemplateBase<char,_true>.
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX._4_4_,
                              (int)tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>
                                   .super_SmallVectorTemplateBase<char,_true>.
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX),
             (char *)CONCAT44(tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                              super_SmallVectorTemplateBase<char,_true>.
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX._4_4_,
                              (int)tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>
                                   .super_SmallVectorTemplateBase<char,_true>.
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX) +
             (tempDir.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase._8_8_ & 0xffffffff));
  llvm::Twine::Twine((Twine *)&statbuf,"link_to_other_dir");
  pcVar3 = "";
  llvm::Twine::Twine((Twine *)&gtest_ar__2,"");
  llvm::Twine::Twine((Twine *)local_848,"");
  llvm::Twine::Twine((Twine *)local_870,"");
  llvm::sys::path::append
            (&directoryLinkPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,
             (Twine *)&statbuf,(Twine *)&gtest_ar__2,(Twine *)local_848,(Twine *)local_870);
  pcVar4 = llvm::SmallString<256U>::c_str(&otherDir);
  pcVar5 = llvm::SmallString<256U>::c_str
                     ((SmallString<256U> *)&directoryLinkPath.super_SmallVector<char,_256U>);
  res = llbuild::basic::sys::symlink(pcVar4,pcVar5);
  gtest_ar__2.success_ = false;
  gtest_ar__2._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>((internal *)&statbuf,"res","0",&res,(int *)&gtest_ar__2);
  if ((char)statbuf.st_dev == '\0') {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (statbuf.st_ino != 0) {
      pcVar3 = *(char **)statbuf.st_ino;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_848,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_848);
    if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&statbuf.st_ino);
  llbuild::basic::createLocalFileSystem();
  CVar1 = local_848[0];
  pcVar3 = llvm::SmallString<256U>::c_str(&tempDir);
  std::__cxx11::string::string((string *)&statbuf,pcVar3,(allocator *)&gtest_ar__2);
  bVar2 = (bool)(**(code **)(*CVar1.decUL + 0x28))(CVar1.twine,&statbuf);
  std::__cxx11::string::_M_dispose();
  gtest_ar__2.success_ = bVar2;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar2 == false) {
    testing::Message::Message((Message *)local_870);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&statbuf,(internal *)&gtest_ar__2,(AssertionResult *)"result","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x92,(char *)CONCAT44(statbuf.st_dev._4_4_,(undefined4)statbuf.st_dev));
    testing::internal::AssertHelper::operator=(&local_890,(Message *)local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_890);
    std::__cxx11::string::_M_dispose();
    if ((long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  local_870[0].decUI = 0xffffffff;
  pcVar3 = llvm::SmallString<256U>::c_str(&tempDir);
  local_890.data_._0_4_ = llbuild::basic::sys::stat(pcVar3,(stat *)&statbuf);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"-1","sys::stat(tempDir.c_str(), &statbuf)",&local_870[0].decI
             ,(int *)&local_890);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)local_870);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=(&local_890,(Message *)local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_890);
    if ((long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  local_870[0].decUI = 2;
  rhs = __errno_location();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"2","(*__errno_location ())",&local_870[0].decI,rhs);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)local_870);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=(&local_890,(Message *)local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_890);
    if ((long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  local_870[0].decUI = 0;
  pcVar3 = llvm::SmallString<256U>::c_str(&file);
  local_890.data_._0_4_ = llbuild::basic::sys::stat(pcVar3,(stat *)&statbuf);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"0","sys::stat(file.c_str(), &statbuf)",&local_870[0].decI,
             (int *)&local_890);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)local_870);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=(&local_890,(Message *)local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_890);
    if ((long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  local_870[0].decUI = 0;
  pcVar3 = llvm::SmallString<256U>::c_str(&otherFile);
  local_890.data_._0_4_ = llbuild::basic::sys::stat(pcVar3,(stat *)&statbuf);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar__2,"0","sys::stat(otherFile.c_str(), &statbuf)",
             &local_870[0].decI,(int *)&local_890);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)local_870);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar__2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x9a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_890,(Message *)local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_890);
    if ((long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_870[0]._4_4_,local_870[0].decUI) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  if (local_848[0].twine != (Twine *)0x0) {
    (**(code **)(*local_848[0].decUL + 8))();
  }
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&directoryLinkPath);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&linkPath);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&tempDir);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&otherFile);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&otherDir);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&file);
  llbuild::TmpDir::~TmpDir(&rootTempDir);
  return;
}

Assistant:

TEST(FileSystemTest, testRecursiveRemovalDoesNotFollowSymlinks) {
  TmpDir rootTempDir(__func__);

  SmallString<256> file{ rootTempDir.str() };
  llvm::sys::path::append(file, "test.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(file.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  SmallString<256> otherDir{ rootTempDir.str() };
  llvm::sys::path::append(otherDir, "other_dir");
  sys::mkdir(otherDir.c_str());

  SmallString<256> otherFile{ otherDir.str() };
  llvm::sys::path::append(otherFile, "test.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(otherFile.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  SmallString<256> tempDir { rootTempDir.str() };
  llvm::sys::path::append(tempDir, "root");
  sys::mkdir(tempDir.c_str());

  SmallString<256> linkPath { tempDir.str() };
  llvm::sys::path::append(linkPath, "link.txt");
  int res = sys::symlink(file.c_str(), linkPath.c_str());
  EXPECT_EQ(res, 0);

  SmallString<256> directoryLinkPath { tempDir.str() };
  llvm::sys::path::append(directoryLinkPath, "link_to_other_dir");
  res = sys::symlink(otherDir.c_str(), directoryLinkPath.c_str());
  EXPECT_EQ(res, 0);

  auto fs = createLocalFileSystem();
  bool result = fs->remove(tempDir.c_str());
  EXPECT_TRUE(result);

  sys::StatStruct  statbuf;
  EXPECT_EQ(-1, sys::stat(tempDir.c_str(), &statbuf));
  EXPECT_EQ(ENOENT, errno);
  // Verify that the symlink target still exists.
  EXPECT_EQ(0, sys::stat(file.c_str(), &statbuf));
  // Verify that we did not delete the symlinked directories contents.
  EXPECT_EQ(0, sys::stat(otherFile.c_str(), &statbuf));
}